

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_SampleSimple_Test::TestBody(Image_SampleSimple_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<float> init;
  undefined1 auVar1 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  bool bVar2;
  string *this_00;
  Point2f PVar3;
  undefined8 extraout_XMM0_Qb;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Point2f p;
  Float pdf;
  Point2f u;
  int i;
  RNG rng;
  PiecewiseConstant2D distrib;
  Image zeroOne;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> texels;
  float in_stack_fffffffffffffbe8;
  float in_stack_fffffffffffffbec;
  Image *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc0c;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  Type in_stack_fffffffffffffc1c;
  Allocator in_stack_fffffffffffffc20;
  PiecewiseConstant2D *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  AssertHelper *this_01;
  Bounds2f *domain;
  function<float_(pbrt::Point2<float>)> *in_stack_fffffffffffffc98;
  Image *in_stack_fffffffffffffca0;
  Allocator in_stack_fffffffffffffca8;
  char *in_stack_fffffffffffffcb0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcb8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffcc0;
  Image *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  size_t in_stack_fffffffffffffcd8;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffce0;
  int local_304;
  RNG local_300 [16];
  undefined1 local_1f2;
  allocator<char> local_1f1;
  AssertHelper *local_1f0;
  AssertHelper local_1e8 [4];
  AssertHelper *local_1c8;
  undefined8 local_1c0;
  Bounds2f local_190 [20];
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 *local_38;
  undefined8 local_30;
  
  local_48 = 0;
  local_44 = 0x3f800000;
  local_40 = 0;
  local_3c = 0;
  local_38 = &local_48;
  local_30 = 4;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)in_stack_fffffffffffffbf0);
  init._M_array._4_4_ = in_stack_fffffffffffffc0c;
  init._M_array._0_4_ = in_stack_fffffffffffffc08;
  init._M_len = (size_type)in_stack_fffffffffffffc10;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (in_stack_fffffffffffffc00,init,
             (polymorphic_allocator<float> *)
             CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
  domain = local_190;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)in_stack_fffffffffffffbf0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (in_stack_fffffffffffffc10,
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
             &in_stack_fffffffffffffc00->alloc);
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffffbf0,(int)in_stack_fffffffffffffbec,
             (int)in_stack_fffffffffffffbe8);
  local_1f2 = 1;
  this_01 = local_1e8;
  local_1f0 = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
             (char *)in_stack_fffffffffffffc28,
             (allocator<char> *)in_stack_fffffffffffffc20.memoryResource);
  local_1f2 = 0;
  local_1c8 = local_1e8;
  local_1c0 = 1;
  v._M_array._7_1_ = in_stack_fffffffffffffbff;
  v._M_array._0_7_ = in_stack_fffffffffffffbf8;
  v._M_len = (size_type)in_stack_fffffffffffffc00;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffffbf0,v);
  channels.n = in_stack_fffffffffffffcd8;
  channels.ptr = in_stack_fffffffffffffcd0;
  pbrt::Image::Image(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (Point2i)in_stack_fffffffffffffce0,channels);
  this_00 = (string *)&local_1c8;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != (string *)local_1e8);
  std::allocator<char>::~allocator(&local_1f1);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffffbf0);
  std::function<float(pbrt::Point2<float>)>::
  function<pbrt::Image::GetSamplingDistribution(std::function<float(pbrt::Point2<float>)>,pbrt::Bounds2<float>const&,pstd::pmr::polymorphic_allocator<std::byte>)::_default_arg_3_::_lambda(pbrt::Point2<float>)_1_,void>
            ((function<float_(pbrt::Point2<float>)> *)in_stack_fffffffffffffc00,
             (anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
  pbrt::Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
             in_stack_fffffffffffffbe8);
  pbrt::Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
             in_stack_fffffffffffffbe8);
  pbrt::Bounds2<float>::Bounds2
            ((Bounds2<float> *)in_stack_fffffffffffffc00,
             (Point2<float> *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
             (Point2<float> *)in_stack_fffffffffffffbf0);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffbf0);
  pbrt::Image::GetSamplingDistribution
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,domain,in_stack_fffffffffffffca8);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffbf0);
  pbrt::PiecewiseConstant2D::PiecewiseConstant2D
            ((PiecewiseConstant2D *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
             (Array2D<float> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc20);
  pbrt::Array2D<float>::~Array2D((Array2D<float> *)in_stack_fffffffffffffc00);
  std::function<float_(pbrt::Point2<float>)>::~function
            ((function<float_(pbrt::Point2<float>)> *)0x5cbc70);
  pbrt::RNG::RNG(local_300);
  for (local_304 = 0; local_304 < 1000; local_304 = local_304 + 1) {
    pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffbf0);
    pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffffbf0);
    pbrt::Point2<float>::Point2
              ((Point2<float> *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               in_stack_fffffffffffffbe8);
    PVar3 = pbrt::PiecewiseConstant2D::Sample
                      (in_stack_fffffffffffffc28,(Point2f *)in_stack_fffffffffffffc20.memoryResource
                       ,(Float *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    auVar1._8_8_ = extraout_XMM0_Qb;
    auVar1._0_4_ = PVar3.super_Tuple2<pbrt::Point2,_float>.x;
    auVar1._4_4_ = PVar3.super_Tuple2<pbrt::Point2,_float>.y;
    vmovlpd_avx(auVar1);
    testing::internal::CmpHelperGE<float,double>
              ((char *)in_stack_fffffffffffffcb8.ptr_,in_stack_fffffffffffffcb0,
               (float *)in_stack_fffffffffffffca8.memoryResource,(double *)in_stack_fffffffffffffca0
              );
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffcd8);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc20.memoryResource);
      in_stack_fffffffffffffc00 =
           (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x5cbf1d);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffc20.memoryResource,in_stack_fffffffffffffc1c,
                 (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,
                 (char *)in_stack_fffffffffffffc00);
      testing::internal::AssertHelper::operator=(this_01,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
      testing::Message::~Message((Message *)0x5cbf7a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cbfcf);
    in_stack_fffffffffffffca8.memoryResource = (memory_resource *)0x3fe0000000000000;
    testing::internal::CmpHelperLE<float,double>
              ((char *)in_stack_fffffffffffffcb8.ptr_,in_stack_fffffffffffffcb0,
               (float *)0x3fe0000000000000,(double *)in_stack_fffffffffffffca0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffcb0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc20.memoryResource);
      in_stack_fffffffffffffbf0 =
           (Image *)testing::AssertionResult::failure_message((AssertionResult *)0x5cc077);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffc20.memoryResource,in_stack_fffffffffffffc1c,
                 (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c,
                 (char *)in_stack_fffffffffffffc00);
      testing::internal::AssertHelper::operator=(this_01,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbf0);
      testing::Message::~Message((Message *)0x5cc0d4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5cc129);
  }
  pbrt::PiecewiseConstant2D::~PiecewiseConstant2D((PiecewiseConstant2D *)in_stack_fffffffffffffbf0);
  pbrt::Image::~Image(in_stack_fffffffffffffbf0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffffbf0);
  return;
}

Assistant:

TEST(Image, SampleSimple) {
    pstd::vector<float> texels = {Float(0), Float(1), Float(0), Float(0)};
    Image zeroOne(texels, {2, 2}, {"Y"});
    PiecewiseConstant2D distrib(zeroOne.GetSamplingDistribution());
    RNG rng;
    for (int i = 0; i < 1000; ++i) {
        Point2f u(rng.Uniform<Float>(), rng.Uniform<Float>());
        Float pdf;
        Point2f p = distrib.Sample(u, &pdf);
        // Due to bilerp on lookup, the non-zero range goes out a bit.
        EXPECT_GE(p.x, 0.5);
        EXPECT_LE(p.y, 0.5);
    }
}